

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateJSType
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FieldDescriptorProto *descriptor;
  Type TVar1;
  FieldOptions *this_00;
  string_view element_name;
  anon_class_8_1_5c90c141 local_50;
  VoidPtr local_48;
  Invoker<std::__cxx11::basic_string<char>_> local_40;
  string_view local_38;
  FieldOptions_JSType local_24;
  FieldDescriptorProto *pFStack_20;
  JSType jstype;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  pFStack_20 = proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  this_00 = FieldDescriptor::options(field);
  local_24 = FieldOptions::jstype(this_00);
  if (local_24 != FieldOptions_JSType_JS_NORMAL) {
    TVar1 = FieldDescriptor::type((FieldDescriptor *)proto_local);
    if ((((TVar1 - TYPE_INT64 < 2) || (TVar1 == TYPE_FIXED64)) || (TVar1 == TYPE_SFIXED64)) ||
       (TVar1 == MAX_TYPE)) {
      if ((local_24 != FieldOptions_JSType_JS_STRING) && (local_24 != FieldOptions_JSType_JS_NUMBER)
         ) {
        local_38 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        descriptor = pFStack_20;
        local_50.jstype = &local_24;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_48,&local_50);
        make_error.invoker_ = local_40;
        make_error.ptr_.obj = local_48.obj;
        AddError(this,local_38,&descriptor->super_Message,TYPE,make_error);
      }
    }
    else {
      element_name = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      AddError(this,element_name,&pFStack_20->super_Message,TYPE,
               "jstype is only allowed on int64, uint64, sint64, fixed64 or sfixed64 fields.");
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateJSType(const FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  FieldOptions::JSType jstype = field->options().jstype();
  // The default is always acceptable.
  if (jstype == FieldOptions::JS_NORMAL) {
    return;
  }

  switch (field->type()) {
    // Integral 64-bit types may be represented as JavaScript numbers or
    // strings.
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64:
      if (jstype == FieldOptions::JS_STRING ||
          jstype == FieldOptions::JS_NUMBER) {
        return;
      }
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               [&] {
                 return absl::StrCat(
                     "Illegal jstype for int64, uint64, sint64, fixed64 "
                     "or sfixed64 field: ",
                     FieldOptions_JSType_descriptor()->value(jstype)->name());
               });
      break;

    // No other types permit a jstype option.
    default:
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "jstype is only allowed on int64, uint64, sint64, fixed64 "
               "or sfixed64 fields.");
      break;
  }
}